

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_7,_11>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  bool bVar2;
  int i;
  bool bVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  float fVar7;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Type in0;
  float afStack_110 [6];
  float local_f8 [4];
  float local_e8 [2];
  ulong local_e0;
  undefined4 local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  float local_a4;
  undefined8 local_a0;
  Matrix<float,_4,_2> local_98;
  Matrix<float,_2,_4> local_78;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_3c;
  undefined4 local_34;
  undefined4 local_30;
  undefined8 local_28;
  undefined8 local_20;
  float local_14;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_98.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_98.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_98.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_98.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
    local_98.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_98.m_data.m_data[1].m_data[3] = evalCtx->in[1].m_data[3];
  }
  else {
    local_98.m_data.m_data[0].m_data[0] = -0.6;
    local_98.m_data.m_data[0].m_data[1] = -0.6;
    local_98.m_data.m_data[0].m_data[2] = -0.2;
    local_98.m_data.m_data[0].m_data[3] = -0.1;
    local_98.m_data.m_data[1].m_data[0] = -1.1;
    local_98.m_data.m_data[1].m_data[1] = -0.6;
    local_98.m_data.m_data[1].m_data[2] = -0.6;
    local_98.m_data.m_data[1].m_data[3] = -0.1;
  }
  pfVar1 = local_78.m_data.m_data[0].m_data + 1;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    pfVar5 = (float *)&local_78;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar6 = 0;
      do {
        fVar7 = 1.0;
        if (lVar4 != lVar6) {
          fVar7 = 0.0;
        }
        pfVar5[lVar6 * 2] = fVar7;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar4 = 1;
      pfVar5 = pfVar1;
      bVar2 = false;
    } while (bVar3);
    local_78.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_78.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_78.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    local_78.m_data.m_data[3].m_data = *(float (*) [2])evalCtx->in[3].m_data;
  }
  else {
    local_78.m_data.m_data[2].m_data[0] = 0.0;
    local_78.m_data.m_data[2].m_data[1] = 0.0;
    local_78.m_data.m_data[3].m_data[0] = 0.0;
    local_78.m_data.m_data[3].m_data[1] = 0.0;
    local_78.m_data.m_data[0].m_data[0] = 0.0;
    local_78.m_data.m_data[0].m_data[1] = 0.0;
    local_78.m_data.m_data[1].m_data[0] = 0.0;
    local_78.m_data.m_data[1].m_data[1] = 0.0;
    lVar4 = 0;
    pfVar5 = (float *)&local_78;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar6 = 0;
      do {
        pfVar5[lVar6 * 2] = *(float *)((long)&DAT_00af0b40 + lVar6 * 4 + lVar4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar4 = 0x10;
      pfVar5 = pfVar1;
      bVar2 = false;
    } while (bVar3);
  }
  afStack_110[0] = 8.177625e-39;
  afStack_110[1] = 0.0;
  tcu::operator*(&local_98,&local_78);
  local_b0 = local_50;
  local_a8 = local_48;
  local_c0 = local_3c;
  local_b8 = local_34;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[2] = 0.0;
  lVar4 = 0;
  do {
    local_f8[lVar4] =
         *(float *)((long)&local_b0 + lVar4 * 4) + *(float *)((long)&local_c0 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_d0 = local_28;
  local_c8 = local_30;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e0 = local_e0 & 0xffffffff00000000;
  lVar4 = 0;
  do {
    local_e8[lVar4] = local_f8[lVar4] + *(float *)((long)&local_d0 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_a4 = local_14;
  local_a0 = local_20;
  afStack_110[2] = 0.0;
  afStack_110[3] = 0.0;
  afStack_110[4] = 0.0;
  lVar4 = 0;
  do {
    afStack_110[lVar4 + 2] = local_e8[lVar4] + (&local_a4)[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_e0 = 0x100000000;
  local_d8 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)local_e8[lVar4]] = afStack_110[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}